

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

JavascriptPromiseAnyRejectElementFunction * __thiscall
Js::JavascriptLibrary::CreatePromiseAnyRejectElementFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,uint32 index,JavascriptArray *errors,
          JavascriptPromiseCapability *capabilities,
          JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *remainingElements,
          JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *alreadyCalledWrapper)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  DynamicType *type;
  Recycler *this_00;
  undefined4 *puVar4;
  JavascriptPromiseAnyRejectElementFunction *this_01;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  data._32_8_ = errors;
  type = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Function,
                          &((this->super_JavascriptLibraryBase).functionPrototype.ptr)->
                           super_RecyclableObject,entryPoint,
                          (DynamicTypeHandler *)
                          &DeferredTypeHandler<&(bool_Js::JavascriptLibrary::InitializeFunction<false,false,false,false>(Js::DynamicObject*,Js::DeferredTypeHandlerBase*,Js::DeferredInitializeMode)),Js::InitializeFunctionDeferredTypeHandlerFilter<false,false,false>,false,(unsigned_short)0,(unsigned_short)0>
                           ::defaultInstance,false,false);
  local_68 = (undefined1  [8])&JavascriptPromiseAnyRejectElementFunction::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_766a001;
  data.filename._0_4_ = 0x1a08;
  this_00 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_68);
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                ,0xa63,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_00c0283b;
    *puVar4 = 0;
  }
  this_01 = (JavascriptPromiseAnyRejectElementFunction *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)1,false>
                      (this_00,0x70);
  if (this_01 == (JavascriptPromiseAnyRejectElementFunction *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                ,0xa70,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
LAB_00c0283b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  JavascriptPromiseAnyRejectElementFunction::JavascriptPromiseAnyRejectElementFunction
            (this_01,type,(FunctionInfo *)JavascriptPromise::EntryInfo::AnyRejectElementFunction,
             index,(JavascriptArray *)data._32_8_,capabilities,remainingElements,
             alreadyCalledWrapper);
  return this_01;
}

Assistant:

JavascriptPromiseAnyRejectElementFunction* JavascriptLibrary::CreatePromiseAnyRejectElementFunction(JavascriptMethod entryPoint, uint32 index, JavascriptArray* errors, JavascriptPromiseCapability* capabilities, JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* remainingElements, JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyCalledWrapper)
    {
        FunctionInfo* functionInfo = &Js::JavascriptPromise::EntryInfo::AnyRejectElementFunction;
        DynamicType* type = DynamicType::New(scriptContext, TypeIds_Function, functionPrototype, entryPoint, GetDeferredAnonymousFunctionTypeHandler());
        JavascriptPromiseAnyRejectElementFunction* function = RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, JavascriptPromiseAnyRejectElementFunction, type, functionInfo, index, errors, capabilities, remainingElements, alreadyCalledWrapper);
        // Length should be 1 but not accessible from script.
        return function;
    }